

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
* __thiscall
QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
::operator[](QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
             *this,_List_iterator<Item> *key)

{
  QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>,_bool>
  pVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  local_a0;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_98;
  pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_a0.d.ptr ==
       (QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
           *)local_a0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_a0.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )(QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
       *)local_a0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
                        *)local_a0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<std::_List_iterator<Item>,_std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>,_std::_Select1st<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
    ::
    pair<std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_true>
              (&local_60,key,
               (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)&local_98);
    pVar3 = std::
            _Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>,std::_Select1st<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>>
            ::
            _M_insert_unique<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>
                      ((_Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>,std::_Select1st<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>>
                        *)&pQVar1->m,&local_60);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
    ::~_Rb_tree(&local_60.second._M_t);
    std::
    _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
    ::~_Rb_tree(&local_98);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
            *)&iVar2._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }